

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::SendTuningParams(CGameContext *this,int ClientID)

{
  IServer *pIVar1;
  uint in_ESI;
  CGameContext *in_RDI;
  long in_FS_OFFSET;
  uint i;
  int *pParams;
  CMsgPacker Msg;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  uint uVar2;
  undefined1 local_820 [2072];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CheckPureTuning(in_RDI);
  CMsgPacker::CMsgPacker
            ((CMsgPacker *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  for (uVar2 = 0; uVar2 < 0x20; uVar2 = uVar2 + 1) {
    CPacker::AddInt((CPacker *)CONCAT44(uVar2,in_stack_fffffffffffff7c0),
                    (int)((ulong)in_RDI >> 0x20));
  }
  pIVar1 = Server(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[9])(pIVar1,local_820,1,(ulong)in_ESI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::SendTuningParams(int ClientID)
{
	CheckPureTuning();

	CMsgPacker Msg(NETMSGTYPE_SV_TUNEPARAMS);
	int *pParams = (int *)&m_Tuning;
	for(unsigned i = 0; i < sizeof(m_Tuning)/sizeof(int); i++)
		Msg.AddInt(pParams[i]);
	Server()->SendMsg(&Msg, MSGFLAG_VITAL, ClientID);
}